

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertions.h
# Opt level: O2

void cgreen::assert_that_<char*>
               (char *file,int line,char *actual_string,char *actual,Constraint *constraint)

{
  bool bVar1;
  char *local_30;
  
  local_30 = actual;
  bVar1 = std::type_info::operator==
                    ((type_info *)&char*::typeinfo,(type_info *)&std::__cxx11::string::typeinfo);
  if (!bVar1) {
    bVar1 = std::type_info::operator==
                      ((type_info *)&char*::typeinfo,(type_info *)&std::__cxx11::string::typeinfo);
    if (!bVar1) {
      bVar1 = std::type_info::operator==
                        ((type_info *)&char*::typeinfo,
                         (type_info *)&std::__cxx11::string_const*::typeinfo);
      if (!bVar1) {
        bVar1 = std::type_info::operator==
                          ((type_info *)&char*::typeinfo,
                           (type_info *)&std::__cxx11::string*::typeinfo);
        if (!bVar1) {
          bVar1 = std::type_info::operator==
                            ((type_info *)&char*::typeinfo,
                             (type_info *)&std::__cxx11::string::typeinfo);
          if (bVar1) {
            cgreen::assert_that_(file,line,actual_string,(string *)&local_30,constraint);
            return;
          }
          cgreen::assert_that_(file,line,actual_string,(long)actual,constraint);
          return;
        }
      }
    }
  }
  cgreen::assert_that_(file,line,actual_string,(string *)actual,constraint);
  return;
}

Assistant:

void assert_that_(const char *file, int line, const char *actual_string, T actual, Constraint *constraint) {

        if (typeid(actual) == typeid(std::string&) ||
            typeid(actual) == typeid(const std::string&) ||
            typeid(actual) == typeid(const std::string*) ||
            typeid(actual) == typeid(std::string*)) {

            assert_that_(file, line, actual_string, reinterpret_cast<const std::string *>(actual), constraint);

        } else if (typeid(actual) == typeid(std::string)) {

            assert_that_(file, line, actual_string, (const std::string *)&actual, constraint);

        } else {
            // TODO: update actual_string with output from operator<< of (T)actual
            assert_that_(file, line, actual_string, (intptr_t)actual, constraint);
        }
    }